

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_test.cc
# Opt level: O2

void __thiscall
visitor_test_should_visit_unknown_tags_in_non_strict_mode_Test::
visitor_test_should_visit_unknown_tags_in_non_strict_mode_Test
          (visitor_test_should_visit_unknown_tags_in_non_strict_mode_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00b899c0;
  return;
}

Assistant:

TEST(visitor_test, should_visit_unknown_tags_in_non_strict_mode)
{
    const char* frame = "8=FIX.4.4|9=0000|35=W|49=Prov|56=MDABC|55=AUD/CAD|262=1709|"
                        "10721=CUSTOM1|"
                        "711=1|"
                            "311=AUD/CAD|"
                            "10541=CUSTOM2|"
                            "457=1|"
                                "458=TESTID|459=TESTSOURCE|10872=CUSTOM3|10873=CUSTOM4|"
                            "462=1|"
                        "292=D|268=2|"
                            "269=0|271=500000|272=20170103|299=02z00000hdi:A|10331=CUSTOM5|"
                            "269=1|271=500000|272=20170103|299=02z00000hdi:A|10331=CUSTOM6|"
                        "10=213";
    using Visitor = should_visit_unknown_tags_in_non_strict_mode::Visitor;
    using VisitRules = should_visit_unknown_tags_in_non_strict_mode::VisitRules;

    auto err = doVisit(frame, Visitor(), VisitRules());
    ASSERT_TRUE(err.isOk());
}